

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O2

void dataOfferHandleOffer(void *userData,wl_data_offer *offer,char *mimeType)

{
  _GLFWofferWayland *p_Var1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  p_Var1 = _glfw.wl.offers;
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    if ((ulong)_glfw.wl.offerCount * 0x10 + 0x10 == lVar4 + 0x10) {
      return;
    }
    lVar2 = lVar4 + 0x10;
  } while (*(wl_data_offer **)((long)&(_glfw.wl.offers)->offer + lVar4) != offer);
  iVar3 = strcmp(mimeType,"text/plain;charset=utf-8");
  if (iVar3 == 0) {
    *(undefined4 *)((long)&p_Var1->text_plain_utf8 + lVar4) = 1;
  }
  else {
    iVar3 = strcmp(mimeType,"text/uri-list");
    if (iVar3 == 0) {
      *(undefined4 *)((long)&p_Var1->text_uri_list + lVar4) = 1;
    }
  }
  return;
}

Assistant:

static void dataOfferHandleOffer(void* userData,
                                 struct wl_data_offer* offer,
                                 const char* mimeType)
{
    for (unsigned int i = 0; i < _glfw.wl.offerCount; i++)
    {
        if (_glfw.wl.offers[i].offer == offer)
        {
            if (strcmp(mimeType, "text/plain;charset=utf-8") == 0)
                _glfw.wl.offers[i].text_plain_utf8 = GLFW_TRUE;
            else if (strcmp(mimeType, "text/uri-list") == 0)
                _glfw.wl.offers[i].text_uri_list = GLFW_TRUE;

            break;
        }
    }
}